

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::
       MessageSize<google::protobuf::SourceCodeInfo_Location>(SourceCodeInfo_Location *value)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  
  sVar2 = SourceCodeInfo_Location::ByteSizeLong(value);
  uVar3 = (uint)sVar2 | 1;
  iVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  return sVar2 + (iVar1 * 9 + 0x49U >> 6);
}

Assistant:

inline size_t WireFormatLite::MessageSize(const MessageType& value) {
  return LengthDelimitedSize(value.ByteSizeLong());
}